

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_normal.c
# Opt level: O0

bool_t prf_vertex_with_normal_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  void *pvVar4;
  int iVar5;
  bfile_t *in_RDX;
  long *in_RSI;
  ushort *in_RDI;
  float32_t fVar6;
  float64_t fVar7;
  FILE *pFVar8;
  bfile_t *unaff_retaddr;
  node_data_conflict14 *data;
  int pos;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  uint in_stack_ffffffffffffffdc;
  int iVar9;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar10;
  
  uVar1 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
  *in_RDI = uVar1;
  if (*in_RDI == prf_vertex_with_normal_info.opcode) {
    uVar1 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
    in_RDI[1] = uVar1;
    if (in_RDI[1] < 0x20) {
      prf_error(6,"vertex with normal node to short (%d bytes, not supported).",(ulong)in_RDI[1]);
      bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
    }
    if ((4 < in_RDI[1]) && (*(long *)(in_RDI + 4) == 0)) {
      if (*(short *)(*in_RSI + 8) == 0) {
        pvVar4 = malloc((long)(int)(in_RDI[1] - 4));
        *(void **)(in_RDI + 4) = pvVar4;
      }
      else {
        pvVar4 = pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
        *(void **)(in_RDI + 4) = pvVar4;
      }
      if (*(long *)(in_RDI + 4) == 0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
        return 0;
      }
    }
    iVar9 = 4;
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    uVar1 = bf_get_uint16_be(bfile_00);
    *(uint16_t *)&bfile_00->pos = uVar1;
    iVar9 = iVar9 + 2;
    uVar1 = bf_get_uint16_be(bfile_00);
    *(uint16_t *)((long)&bfile_00->pos + 2) = uVar1;
    iVar9 = iVar9 + 2;
    fVar7 = bf_get_float64_be(bfile_00);
    *(float64_t *)bfile_00 = fVar7;
    iVar9 = iVar9 + 8;
    pFVar8 = (FILE *)bf_get_float64_be(bfile_00);
    bfile_00->file = pFVar8;
    iVar9 = iVar9 + 8;
    fVar7 = bf_get_float64_be(bfile_00);
    bfile_00->size = (size_t)fVar7;
    iVar2 = iVar9 + 8;
    if (iVar9 + 0xc <= (int)(uint)in_RDI[1]) {
      fVar6 = bf_get_float32_be(bfile_00);
      *(float32_t *)((long)&bfile_00->pos + 4) = fVar6;
      iVar9 = iVar2 + 4;
      iVar5 = iVar2 + 8;
      iVar2 = iVar9;
      if (iVar5 <= (int)(uint)in_RDI[1]) {
        fVar6 = bf_get_float32_be(bfile_00);
        *(float32_t *)&bfile_00->ipos = fVar6;
        iVar5 = iVar9 + 4;
        iVar2 = iVar5;
        if (iVar9 + 8 <= (int)(uint)in_RDI[1]) {
          fVar6 = bf_get_float32_be(bfile_00);
          *(float32_t *)((long)&bfile_00->ipos + 4) = fVar6;
          iVar9 = iVar5 + 4;
          iVar2 = iVar9;
          if (iVar5 + 8 <= (int)(uint)in_RDI[1]) {
            uVar3 = bf_get_uint32_be(bfile_00);
            *(uint32_t *)&bfile_00->filename = uVar3;
            iVar2 = iVar9 + 4;
            if (iVar9 + 8 <= (int)(uint)in_RDI[1]) {
              uVar3 = bf_get_uint32_be(bfile_00);
              *(uint32_t *)((long)&bfile_00->filename + 4) = uVar3;
              iVar2 = iVar2 + 4;
            }
          }
        }
      }
    }
    if (iVar2 < (int)(uint)in_RDI[1]) {
      bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(uint)((ulong)in_RDI >> 0x20));
    }
    bVar10 = 1;
  }
  else {
    prf_error(9,"tried vertex with normal load method for node of type %d",(ulong)*in_RDI);
    bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
    bVar10 = 0;
  }
  return bVar10;
}

Assistant:

static
bool_t
prf_vertex_with_normal_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_vertex_with_normal_info.opcode ) {
        prf_error( 9,
            "tried vertex with normal load method for node of type %d",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < 32 ) {
        prf_error( 6,
            "vertex with normal node to short (%d bytes, not supported).",
            node->length );
        bf_rewind( bfile, 4 );
    }

    if ( node->length > 4 && node->data == NULL ) { /* not preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 8 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        assert( data != NULL );
        data->color_name_index = bf_get_uint16_be( bfile ); pos += 2;
        data->flags = bf_get_uint16_be( bfile ); pos += 2;
        prf_dblwrite( data->x, bf_get_float64_be( bfile ) ); pos += 8;
        prf_dblwrite( data->y, bf_get_float64_be( bfile ) ); pos += 8;
        prf_dblwrite( data->z, bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        data->normal[0] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->normal[1] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->normal[2] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->packed_color = bf_get_uint32_be( bfile ); pos += 4;

	/*
	fprintf(stderr,"vertex: %x %x %x\n", 
		data->flags,
		data->color_name_index,
		data->packed_color);
	*/

        if ( node->length < (pos + 4) ) break;
        data->color_index = bf_get_uint32_be( bfile ); pos += 4;

    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}